

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void substr(char *s,int *start,int *count,int *numargs)

{
  ulong __n;
  tagval *ptVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  sVar4 = strlen(s);
  ptVar1 = commandret;
  uVar2 = (uint)sVar4;
  uVar5 = *start;
  if ((int)uVar2 <= *start) {
    uVar5 = uVar2;
  }
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = 0;
  }
  if (*numargs < 3) {
    iVar7 = uVar2 - (int)uVar6;
  }
  else {
    iVar3 = uVar2 - (int)uVar6;
    if (*count < iVar3) {
      iVar3 = *count;
    }
    iVar7 = 0;
    if (0 < iVar3) {
      iVar7 = iVar3;
    }
  }
  __n = (long)iVar7 + 1;
  __dest = (char *)operator_new__(__n);
  strncpy(__dest,s + uVar6,__n);
  __dest[iVar7] = '\0';
  ptVar1->type = 3;
  (ptVar1->super_identval).field_0.s = __dest;
  return;
}

Assistant:

void substr(char *s, int *start, int *count, int *numargs)
{
    int len = strlen(s), offset = clamp(*start, 0, len);
    commandret->setstr(newstring(&s[offset], *numargs >= 3 ? clamp(*count, 0, len - offset) : len - offset));
}